

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O1

void Abc_NtkFraigPartitionedTime(Abc_Ntk_t *pNtk,void *pParams)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Vec_Ptr_t *__ptr;
  Abc_Frame_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  uint *__ptr_00;
  void *pvVar7;
  Abc_Ntk_t *pAVar8;
  Abc_Ntk_t *pAVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  int level;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  timespec ts;
  timespec local_68;
  long local_58;
  void **local_50;
  Abc_Ntk_t *local_48;
  Vec_Ptr_t *local_40;
  void *local_38;
  
  local_38 = pParams;
  iVar3 = clock_gettime(3,&local_68);
  if (iVar3 < 0) {
    lVar11 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
    lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_68.tv_sec * -1000000;
  }
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                  ,0x491,"void Abc_NtkFraigPartitionedTime(Abc_Ntk_t *, void *)");
  }
  pvVar7 = (void *)0x0;
  __ptr = Abc_NtkPartitionSmart(pNtk,300,0);
  pAVar4 = Abc_FrameGetGlobalFrame();
  Cmd_CommandExecute(pAVar4,"unset progressbar");
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 1000;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(8000);
  pVVar5->pArray = ppvVar6;
  uVar1 = __ptr->nSize;
  uVar15 = (ulong)uVar1;
  __ptr_00 = (uint *)malloc(0x10);
  uVar10 = 8;
  if (6 < uVar1 - 1) {
    uVar10 = uVar1;
  }
  __ptr_00[1] = 0;
  *__ptr_00 = uVar10;
  local_58 = lVar11;
  if (uVar10 != 0) {
    pvVar7 = malloc((long)(int)uVar10 << 3);
  }
  *(void **)(__ptr_00 + 2) = pvVar7;
  if (0 < (int)uVar1) {
    local_50 = __ptr->pArray;
    uVar13 = 0;
    local_48 = pNtk;
    local_40 = pVVar5;
    do {
      pVVar5 = local_40;
      pAVar8 = local_48;
      Abc_NtkConvertCos(local_48,(Vec_Int_t *)local_50[uVar13],local_40);
      pAVar8 = Abc_NtkCreateConeArray(pAVar8,pVVar5,0);
      pAVar9 = Abc_NtkFraig(pAVar8,local_38,0,0);
      uVar10 = __ptr_00[1];
      uVar2 = *__ptr_00;
      if (uVar10 == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
            pvVar7 = malloc(0x80);
          }
          else {
            pvVar7 = realloc(*(void **)(__ptr_00 + 2),0x80);
          }
          uVar12 = 0x10;
        }
        else {
          uVar12 = uVar2 * 2;
          if ((int)uVar12 <= (int)uVar2) goto LAB_002eac6b;
          if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
            pvVar7 = malloc((ulong)uVar2 << 4);
          }
          else {
            pvVar7 = realloc(*(void **)(__ptr_00 + 2),(ulong)uVar2 << 4);
          }
        }
        *(void **)(__ptr_00 + 2) = pvVar7;
        *__ptr_00 = uVar12;
      }
LAB_002eac6b:
      __ptr_00[1] = uVar10 + 1;
      *(Abc_Ntk_t **)(*(long *)(__ptr_00 + 2) + (long)(int)uVar10 * 8) = pAVar9;
      Abc_NtkDelete(pAVar8);
      uVar13 = uVar13 + 1;
      printf("Finished part %5d (out of %5d)\r",uVar13 & 0xffffffff,uVar15);
      pVVar5 = local_40;
    } while (uVar15 != uVar13);
  }
  if (0 < (int)uVar1) {
    ppvVar6 = __ptr->pArray;
    uVar13 = 0;
    do {
      pvVar7 = ppvVar6[uVar13];
      if (pvVar7 != (void *)0x0) {
        if (*(void **)((long)pvVar7 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar7 + 8));
          *(undefined8 *)((long)pvVar7 + 8) = 0;
        }
        free(pvVar7);
      }
      uVar13 = uVar13 + 1;
    } while (uVar15 != uVar13);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  if (__ptr != (Vec_Ptr_t *)0x0) {
    free(__ptr);
  }
  pAVar4 = Abc_FrameGetGlobalFrame();
  Cmd_CommandExecute(pAVar4,"set progressbar");
  uVar1 = __ptr_00[1];
  if (0 < (long)(int)uVar1) {
    lVar11 = *(long *)(__ptr_00 + 2);
    lVar14 = 0;
    do {
      Abc_NtkDelete(*(Abc_Ntk_t **)(lVar11 + lVar14 * 8));
      lVar14 = lVar14 + 1;
    } while ((int)uVar1 != lVar14);
  }
  if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
    free(*(void **)(__ptr_00 + 2));
    __ptr_00[2] = 0;
    __ptr_00[3] = 0;
  }
  free(__ptr_00);
  lVar11 = local_58;
  if (pVVar5->pArray != (void **)0x0) {
    free(pVVar5->pArray);
    pVVar5->pArray = (void **)0x0;
  }
  free(pVVar5);
  Abc_Print((int)pVVar5,"%s =","Partitioned fraiging time");
  level = 3;
  iVar3 = clock_gettime(3,&local_68);
  if (iVar3 < 0) {
    lVar14 = -1;
  }
  else {
    lVar14 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
  }
  Abc_Print(level,"%9.2f sec\n",(double)(lVar14 + lVar11) / 1000000.0);
  return;
}

Assistant:

void Abc_NtkFraigPartitionedTime( Abc_Ntk_t * pNtk, void * pParams )
{
    Vec_Ptr_t * vParts, * vFraigs, * vOnePtr;
    Vec_Int_t * vOne;
    Abc_Ntk_t * pNtkAig, * pNtkFraig;
    int i;
    abctime clk = Abc_Clock();

    // perform partitioning
    assert( Abc_NtkIsStrash(pNtk) );
//    vParts = Abc_NtkPartitionNaive( pNtk, 20 );
    vParts = Abc_NtkPartitionSmart( pNtk, 300, 0 );

    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "unset progressbar" );

    // fraig each partition
    vOnePtr = Vec_PtrAlloc( 1000 );
    vFraigs = Vec_PtrAlloc( Vec_PtrSize(vParts) );
    Vec_PtrForEachEntry( Vec_Int_t *, vParts, vOne, i )
    {
        Abc_NtkConvertCos( pNtk, vOne, vOnePtr );
        pNtkAig = Abc_NtkCreateConeArray( pNtk, vOnePtr, 0 );
        pNtkFraig = Abc_NtkFraig( pNtkAig, pParams, 0, 0 );
        Vec_PtrPush( vFraigs, pNtkFraig );
        Abc_NtkDelete( pNtkAig );

        printf( "Finished part %5d (out of %5d)\r", i+1, Vec_PtrSize(vParts) );
    }
    Vec_VecFree( (Vec_Vec_t *)vParts );

    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "set progressbar" );

    // derive the final network
    Vec_PtrForEachEntry( Abc_Ntk_t *, vFraigs, pNtkAig, i )
        Abc_NtkDelete( pNtkAig );
    Vec_PtrFree( vFraigs );
    Vec_PtrFree( vOnePtr );
    ABC_PRT( "Partitioned fraiging time", Abc_Clock() - clk );
}